

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::recalculate_max_load
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           *this)

{
  undefined1 auVar1 [16];
  double in_RDI;
  undefined8 in_XMM0_Qa;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 local_18;
  
  if (*(long *)((long)in_RDI + 0x28) == 0) {
    local_18 = 0;
  }
  else {
    auVar2._0_8_ = (double)*(float *)((long)in_RDI + 0x18);
    auVar2._8_8_ = in_XMM0_Qa;
    auVar1 = vcvtusi2sd_avx512f(ZEXT416((uint)*(float *)((long)in_RDI + 0x18)),
                                *(undefined8 *)((long)in_RDI + 8));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar2._0_8_ * auVar1._0_8_;
    vroundsd_avx(auVar2,auVar3,10);
    local_18 = double_to_size(in_RDI);
  }
  *(size_t *)((long)in_RDI + 0x20) = local_18;
  return;
}

Assistant:

void recalculate_max_load()
        {
            using namespace std;
    
            // From 6.3.1/13:
            // Only resize when size >= mlf_ * count
            max_load_ = buckets_ ? boost::unordered::detail::double_to_size(ceil(
                    static_cast<double>(mlf_) *
                    static_cast<double>(bucket_count_)
                )) : 0;

        }